

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O2

bool bloaty::pe::ReadMagic(string_view *data)

{
  if (data->_M_len < 0x40) {
    return false;
  }
  return *(short *)data->_M_str == 0x5a4d;
}

Assistant:

bool ReadMagic(const string_view& data) {
  // If the size is smaller than a dos header, it cannot be a PE file, right?
  if (data.size() < sizeof(pe_dos_header)) {
    return false;
  }

  uint16_t magic;
  memcpy(&magic, data.data(), sizeof(magic));

  return magic == dos_magic;
}